

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O3

void __thiscall LTACMasterdataChannel::AddIgnore(LTACMasterdataChannel *this)

{
  DatRequTy DVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mtxMaster);
  if (iVar2 == 0) {
    DVar1 = (this->currRequ).type;
    if (DVar1 == DATREQU_AC_MASTER) {
      std::
      _Rb_tree<LTFlightData::FDKeyTy,LTFlightData::FDKeyTy,std::_Identity<LTFlightData::FDKeyTy>,std::less<LTFlightData::FDKeyTy>,std::allocator<LTFlightData::FDKeyTy>>
      ::_M_insert_unique<LTFlightData::FDKeyTy_const&>
                ((_Rb_tree<LTFlightData::FDKeyTy,LTFlightData::FDKeyTy,std::_Identity<LTFlightData::FDKeyTy>,std::less<LTFlightData::FDKeyTy>,std::allocator<LTFlightData::FDKeyTy>>
                  *)&this->setIgnoreAc,&(this->currRequ).acKey);
    }
    else if (DVar1 == DATREQU_ROUTE) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->setIgnoreCallSign,&(this->currRequ).callSign);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void LTACMasterdataChannel::AddIgnore ()
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        // Insert the key to the ignore list if no master data channel can process it
        switch (currRequ.type) {
            case DATREQU_AC_MASTER:
                setIgnoreAc.insert(currRequ.acKey);
                break;
            case DATREQU_ROUTE:
                setIgnoreCallSign.insert(currRequ.callSign);
                break;
            case DATREQU_NONE:
                break;
        }
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
}